

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O3

StringTree * __thiscall
kj::StringTree::
concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
          (StringTree *__return_storage_ptr__,StringTree *this,ArrayPtr<const_char> *params,
          ArrayPtr<const_char> *params_1,ArrayPtr<const_char> *params_2,StringTree *params_3,
          ArrayPtr<const_char> *params_4,ArrayPtr<const_char> *params_5,
          ArrayPtr<const_char> *params_6,ArrayPtr<const_char> *params_7)

{
  Branch *pBVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  Branch *pBVar4;
  const_iterator __begin2;
  char *pos;
  long lVar5;
  long lVar6;
  long lVar7;
  size_t elementCount;
  undefined1 local_a8 [16];
  size_t local_98;
  char *local_90;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  String local_60;
  StringTree *local_48;
  StringTree *local_40;
  StringTree *local_38;
  
  lVar6 = 0;
  lVar7 = 0;
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  *(undefined1 (*) [16])&(__return_storage_ptr__->text).content.disposer = (undefined1  [16])0x0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  (__return_storage_ptr__->text).content.size_ = 0;
  local_a8._0_8_ = (this->text).content.ptr;
  local_a8._8_8_ = params->size_;
  local_98 = params_1->size_;
  local_90 = params_2->ptr;
  local_88._0_8_ = (params_3->text).content.ptr;
  local_88._8_8_ = params_4->size_;
  local_78._0_8_ = params_5->size_;
  local_78._8_8_ = params_6->size_;
  lVar5 = 0;
  do {
    lVar6 = lVar6 + *(long *)(local_a8 + lVar5 * 8);
    lVar7 = lVar7 + *(long *)(local_a8 + lVar5 * 8 + 8);
    lVar5 = lVar5 + 2;
  } while (lVar5 != 8);
  __return_storage_ptr__->size_ = lVar7 + lVar6;
  local_90 = (char *)0x0;
  lVar6 = 0;
  lVar7 = 0;
  lVar5 = 0;
  do {
    lVar6 = lVar6 + *(long *)(local_a8 + lVar5 * 8);
    lVar7 = lVar7 + *(long *)(local_a8 + lVar5 * 8 + 8);
    lVar5 = lVar5 + 2;
  } while (lVar5 != 8);
  heapString(&local_60,lVar7 + lVar6);
  (__return_storage_ptr__->text).content.ptr = local_60.content.ptr;
  (__return_storage_ptr__->text).content.size_ = local_60.content.size_;
  (__return_storage_ptr__->text).content.disposer = local_60.content.disposer;
  lVar6 = 0;
  lVar7 = 0;
  local_a8 = (undefined1  [16])0x0;
  local_98 = 0;
  local_90 = (char *)0x1;
  local_88 = (undefined1  [16])0x0;
  local_78 = (undefined1  [16])0x0;
  lVar5 = 0;
  do {
    lVar6 = lVar6 + *(long *)(local_a8 + lVar5 * 8);
    lVar7 = lVar7 + *(long *)(local_a8 + lVar5 * 8 + 8);
    lVar5 = lVar5 + 2;
  } while (lVar5 != 8);
  elementCount = lVar7 + lVar6;
  local_48 = this;
  local_40 = params_3;
  local_38 = (StringTree *)params_2;
  pBVar4 = (Branch *)
           _::HeapArrayDisposer::allocateImpl
                     (0x40,elementCount,elementCount,
                      _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch>::construct,
                      ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
  local_60.content.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pBVar1 = (__return_storage_ptr__->branches).ptr;
  local_60.content.ptr = (char *)pBVar4;
  local_60.content.size_ = elementCount;
  if (pBVar1 != (Branch *)0x0) {
    sVar2 = (__return_storage_ptr__->branches).size_;
    (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
    (__return_storage_ptr__->branches).size_ = 0;
    pAVar3 = (__return_storage_ptr__->branches).disposer;
    (**pAVar3->_vptr_ArrayDisposer)
              (pAVar3,pBVar1,0x40,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
  }
  (__return_storage_ptr__->branches).ptr = pBVar4;
  (__return_storage_ptr__->branches).size_ = elementCount;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pos = (char *)(__return_storage_ptr__->text).content.size_;
  if (pos != (char *)0x0) {
    pos = (__return_storage_ptr__->text).content.ptr;
  }
  fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,pos,0,(ArrayPtr<const_char> *)local_48,params,params_1,local_38,
             (ArrayPtr<const_char> *)local_40,params_4,params_5,params_6);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}